

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O2

uc_err uc_ctl(uc_engine *uc,uc_control_type control,...)

{
  uint64_t uVar1;
  gint gVar2;
  uc_err uVar3;
  uint64_t *key;
  byte bVar4;
  int iVar5;
  uc_arch uVar6;
  uc_tb *in_RCX;
  uc_tb *in_RDX;
  size_t i;
  uc_tb *puVar7;
  uint uVar8;
  bool bVar9;
  va_list args;
  uc_ctl_exit_request req;
  uc_tb *local_d8;
  
  uVar3 = UC_ERR_ARG;
  if (0xe < (ushort)control) {
    return UC_ERR_ARG;
  }
  uVar8 = control >> 0x1e;
  switch(control & 0xffff) {
  case UC_CTL_UC_MODE:
    if (uVar8 != 2) {
      return UC_ERR_ARG;
    }
    uVar6 = uc->mode;
    goto LAB_0049765d;
  case UC_CTL_UC_PAGE_SIZE:
    if (uVar8 == 2) {
      if ((uc->init_done == false) &&
         (uVar3 = uc_init_engine(uc), local_d8 = in_RDX, uVar3 != UC_ERR_OK)) {
        return uVar3;
      }
      uVar6 = uc->target_page_size;
      goto LAB_0049765d;
    }
    if (uc->init_done != false) {
      return UC_ERR_ARG;
    }
    if (uc->arch != UC_ARCH_ARM) {
      return UC_ERR_ARG;
    }
    uVar8 = (uc_context_content)local_d8 - ((uc_context_content)local_d8 >> 1 & 0x55555555);
    uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333);
    if (1 < ((uVar8 >> 4) + uVar8 & 0xf0f0f0f) * 0x1010101 >> 0x18) {
      return UC_ERR_ARG;
    }
    iVar5 = 0;
    for (; (uc_context_content)local_d8 != 0; local_d8._0_4_ = (uc_context_content)local_d8 >> 1) {
      iVar5 = iVar5 + 1;
    }
    uc->target_bits = iVar5;
    break;
  case UC_CTL_UC_ARCH:
    if (uVar8 != 2) {
      return UC_ERR_ARG;
    }
    uVar6 = uc->arch;
LAB_0049765d:
    *(uc_arch *)&local_d8->pc = uVar6;
    break;
  case UC_CTL_UC_TIMEOUT:
    if (uVar8 != 2) {
      return UC_ERR_ARG;
    }
    local_d8->pc = uc->timeout;
    break;
  case UC_CTL_UC_USE_EXITS:
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    uc->use_exits = (uc_context_content)local_d8;
    break;
  case UC_CTL_UC_EXITS_CNT:
    if ((uc->init_done == false) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar8 != 2) {
      return UC_ERR_ARG;
    }
    if (uc->use_exits == 0) {
      return UC_ERR_ARG;
    }
    gVar2 = g_tree_nnodes(uc->ctl_exits);
    in_RDX->pc = (long)gVar2;
    break;
  case UC_CTL_UC_EXITS:
    if ((uc->init_done == false) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uc->use_exits == 0) {
      return UC_ERR_ARG;
    }
    if (uVar8 == 1) {
      g_tree_remove_all(uc->ctl_exits);
      for (puVar7 = (uc_tb *)0x0; in_RCX != puVar7; puVar7 = (uc_tb *)((long)&puVar7->pc + 1)) {
        uVar1 = (&in_RDX->pc)[(long)puVar7];
        key = (uint64_t *)g_malloc(8);
        *key = uVar1;
        g_tree_insert(uc->ctl_exits,key,&DAT_00000001);
      }
    }
    else {
      if (uVar8 != 2) {
        return UC_ERR_ARG;
      }
      gVar2 = g_tree_nnodes(uc->ctl_exits);
      if (in_RCX < (uc_tb *)(long)gVar2) {
        return UC_ERR_ARG;
      }
      req.len = 0;
      req.array = &in_RDX->pc;
      g_tree_foreach(uc->ctl_exits,uc_read_exit_iter,&req);
    }
    break;
  case UC_CTL_CPU_MODEL:
    if (uVar8 == 2) {
      if ((uc->init_done == false) &&
         (uVar3 = uc_init_engine(uc), local_d8 = in_RDX, uVar3 != UC_ERR_OK)) {
        return uVar3;
      }
      uVar6 = uc->cpu_model;
      goto LAB_0049765d;
    }
    if ((int)(uc_context_content)local_d8 < 0) {
      return UC_ERR_ARG;
    }
    if (uc->init_done != false) {
      return UC_ERR_ARG;
    }
    switch(uc->arch) {
    case UC_ARCH_ARM:
      if (0x21 < (uc_context_content)local_d8) {
        return UC_ERR_ARG;
      }
      if (((uc->mode & UC_MODE_BIG_ENDIAN) != UC_MODE_ARM) &&
         ((uc_context_content)local_d8 - 0xe < 4)) {
        return UC_ERR_ARG;
      }
      break;
    case UC_ARCH_ARM64:
      if (3 < (uc_context_content)local_d8) {
        return UC_ERR_ARG;
      }
      break;
    case UC_ARCH_MIPS:
      if ((0xf < (uc_context_content)local_d8 & (byte)((uc->mode & UC_MODE_32) >> 2)) != 0) {
        return UC_ERR_ARG;
      }
      bVar4 = (byte)((uc->mode & UC_MODE_64) >> 3);
      bVar9 = (uc_context_content)local_d8 < 0xd;
      goto LAB_00497892;
    case UC_ARCH_X86:
    case UC_ARCH_S390X:
      if (0x25 < (uc_context_content)local_d8) {
        return UC_ERR_ARG;
      }
      break;
    case UC_ARCH_PPC:
      if ((0x121 < (uc_context_content)local_d8 & (byte)((uc->mode & UC_MODE_32) >> 2)) != 0) {
        return UC_ERR_ARG;
      }
      bVar4 = (byte)((uc->mode & UC_MODE_64) >> 3);
      bVar9 = (uc_context_content)local_d8 < 0x13;
      goto LAB_00497892;
    case UC_ARCH_SPARC:
      if ((0xc < (uc_context_content)local_d8 & (byte)((uc->mode & UC_MODE_32) >> 2)) != 0) {
        return UC_ERR_ARG;
      }
      bVar4 = (byte)((uc->mode & UC_MODE_64) >> 3);
      bVar9 = (uc_context_content)local_d8 < 0x11;
LAB_00497892:
      bVar9 = !bVar9;
LAB_004978bf:
      if ((bVar9 & bVar4) != 0) {
        return UC_ERR_ARG;
      }
      break;
    case UC_ARCH_M68K:
      if (8 < (uc_context_content)local_d8) {
        return UC_ERR_ARG;
      }
      break;
    case UC_ARCH_RISCV:
      if ((3 < (uc_context_content)local_d8 & (byte)((uc->mode & UC_MODE_32) >> 2)) != 0) {
        return UC_ERR_ARG;
      }
      bVar9 = 3 < (uc_context_content)local_d8;
      bVar4 = (byte)((uc->mode & UC_MODE_64) >> 3);
      goto LAB_004978bf;
    default:
      goto switchD_004974e8_default;
    }
    uc->cpu_model = (uc_context_content)local_d8;
    break;
  case UC_CTL_TB_REQUEST_CACHE:
    if ((uc->init_done == false) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar8 != 3) {
      return UC_ERR_ARG;
    }
    uVar3 = (*uc->uc_gen_tb)(uc,(uint64_t)in_RDX,in_RCX);
    return uVar3;
  case UC_CTL_TB_REMOVE_CACHE:
    if ((uc->init_done == false) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    if (in_RCX < in_RDX || (long)in_RCX - (long)in_RDX == 0) {
      return UC_ERR_ARG;
    }
    (*uc->uc_invalidate_tb)(uc,(uint64_t)in_RDX,(long)in_RCX - (long)in_RDX);
    break;
  case UC_CTL_TB_FLUSH:
    if ((uc->init_done == false) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    (*uc->tb_flush)(uc);
    break;
  case UC_CTL_TLB_FLUSH:
    if ((uc->init_done == false) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    (*uc->tcg_flush_tlb)(uc);
    break;
  case UC_CTL_TLB_TYPE:
    if ((uc->init_done == false) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    local_d8._0_4_ = (uc_context_content)in_RDX;
    uVar3 = (*uc->set_tlb)(uc,(uc_context_content)local_d8);
    return uVar3;
  case UC_CTL_TCG_BUFFER_SIZE:
    if (uVar8 != 1) {
      if ((uc->init_done == false) &&
         (uVar3 = uc_init_engine(uc), local_d8 = in_RDX, uVar3 != UC_ERR_OK)) {
        return uVar3;
      }
      uVar6 = uc->tcg_buffer_size;
      goto LAB_0049765d;
    }
    uc->tcg_buffer_size = (uc_context_content)local_d8;
    break;
  case UC_CTL_CONTEXT_MODE:
    if ((uc->init_done == false) &&
       (uVar3 = uc_init_engine(uc), local_d8 = in_RDX, uVar3 != UC_ERR_OK)) {
      return uVar3;
    }
    if (uVar8 != 1) {
      return UC_ERR_ARG;
    }
    uc->context_content = (uc_context_content)local_d8;
  }
  uVar3 = UC_ERR_OK;
switchD_004974e8_default:
  return uVar3;
}

Assistant:

UNICORN_EXPORT
uc_err uc_ctl(uc_engine *uc, uc_control_type control, ...)
{
    int rw, type;
    uc_err err = UC_ERR_OK;
    va_list args;

    // MSVC Would do signed shift on signed integers.
    rw = (uint32_t)control >> 30;
    type = (control & ((1 << 16) - 1));
    va_start(args, control);

    switch (type) {
    case UC_CTL_UC_MODE: {
        if (rw == UC_CTL_IO_READ) {
            int *pmode = va_arg(args, int *);
            *pmode = uc->mode;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_ARCH: {
        if (rw == UC_CTL_IO_READ) {
            int *arch = va_arg(args, int *);
            *arch = uc->arch;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_TIMEOUT: {
        if (rw == UC_CTL_IO_READ) {
            uint64_t *arch = va_arg(args, uint64_t *);
            *arch = uc->timeout;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_PAGE_SIZE: {
        if (rw == UC_CTL_IO_READ) {

            UC_INIT(uc);

            uint32_t *page_size = va_arg(args, uint32_t *);
            *page_size = uc->target_page_size;
        } else {
            uint32_t page_size = va_arg(args, uint32_t);
            int bits = 0;

            if (uc->init_done) {
                err = UC_ERR_ARG;
                break;
            }

            if (uc->arch != UC_ARCH_ARM) {
                err = UC_ERR_ARG;
                break;
            }

            if ((page_size & (page_size - 1))) {
                err = UC_ERR_ARG;
                break;
            }

            while (page_size) {
                bits++;
                page_size >>= 1;
            }

            uc->target_bits = bits;

            err = UC_ERR_OK;
        }
        break;
    }

    case UC_CTL_UC_USE_EXITS: {
        if (rw == UC_CTL_IO_WRITE) {
            int use_exits = va_arg(args, int);
            uc->use_exits = use_exits;
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_EXITS_CNT: {

        UC_INIT(uc);

        if (!uc->use_exits) {
            err = UC_ERR_ARG;
        } else if (rw == UC_CTL_IO_READ) {
            size_t *exits_cnt = va_arg(args, size_t *);
            *exits_cnt = g_tree_nnodes(uc->ctl_exits);
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_UC_EXITS: {

        UC_INIT(uc);

        if (!uc->use_exits) {
            err = UC_ERR_ARG;
        } else if (rw == UC_CTL_IO_READ) {
            uint64_t *exits = va_arg(args, uint64_t *);
            size_t cnt = va_arg(args, size_t);
            if (cnt < g_tree_nnodes(uc->ctl_exits)) {
                err = UC_ERR_ARG;
            } else {
                uc_ctl_exit_request req;
                req.array = exits;
                req.len = 0;

                g_tree_foreach(uc->ctl_exits, uc_read_exit_iter, (void *)&req);
            }
        } else if (rw == UC_CTL_IO_WRITE) {
            uint64_t *exits = va_arg(args, uint64_t *);
            size_t cnt = va_arg(args, size_t);

            g_tree_remove_all(uc->ctl_exits);

            for (size_t i = 0; i < cnt; i++) {
                uc_add_exit(uc, exits[i]);
            }
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_CPU_MODEL: {
        if (rw == UC_CTL_IO_READ) {

            UC_INIT(uc);

            int *model = va_arg(args, int *);
            *model = uc->cpu_model;
        } else {
            int model = va_arg(args, int);

            if (model < 0 || uc->init_done) {
                err = UC_ERR_ARG;
                break;
            }

            if (uc->arch == UC_ARCH_X86) {
                if (model >= UC_CPU_X86_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_ARM) {
                if (model >= UC_CPU_ARM_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_BIG_ENDIAN) {
                    // These cpu models don't support big endian code access.
                    if (model <= UC_CPU_ARM_CORTEX_A15 &&
                        model >= UC_CPU_ARM_CORTEX_A7) {
                        err = UC_ERR_ARG;
                        break;
                    }
                }
            } else if (uc->arch == UC_ARCH_ARM64) {
                if (model >= UC_CPU_ARM64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_MIPS) {
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_MIPS32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_64 && model >= UC_CPU_MIPS64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_PPC) {
                // UC_MODE_PPC32 == UC_MODE_32
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_PPC32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_64 && model >= UC_CPU_PPC64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_RISCV) {
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_RISCV32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }

                if (uc->mode & UC_MODE_64 && model >= UC_CPU_RISCV64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_S390X) {
                if (model >= UC_CPU_S390X_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_SPARC) {
                if (uc->mode & UC_MODE_32 && model >= UC_CPU_SPARC32_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
                if (uc->mode & UC_MODE_64 && model >= UC_CPU_SPARC64_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else if (uc->arch == UC_ARCH_M68K) {
                if (model >= UC_CPU_M68K_ENDING) {
                    err = UC_ERR_ARG;
                    break;
                }
            } else {
                err = UC_ERR_ARG;
                break;
            }

            uc->cpu_model = model;

            err = UC_ERR_OK;
        }
        break;
    }

    case UC_CTL_TB_REQUEST_CACHE: {

        UC_INIT(uc);

        if (rw == UC_CTL_IO_READ_WRITE) {
            uint64_t addr = va_arg(args, uint64_t);
            uc_tb *tb = va_arg(args, uc_tb *);
            err = uc->uc_gen_tb(uc, addr, tb);
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_TB_REMOVE_CACHE: {

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            uint64_t addr = va_arg(args, uint64_t);
            uint64_t end = va_arg(args, uint64_t);
            if (end <= addr) {
                err = UC_ERR_ARG;
            } else {
                uc->uc_invalidate_tb(uc, addr, end - addr);
            }
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_TB_FLUSH:

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            uc->tb_flush(uc);
        } else {
            err = UC_ERR_ARG;
        }
        break;

    case UC_CTL_TLB_FLUSH:

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            uc->tcg_flush_tlb(uc);
        } else {
            err = UC_ERR_ARG;
        }
        break;

    case UC_CTL_TLB_TYPE: {

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            int mode = va_arg(args, int);
            err = uc->set_tlb(uc, mode);
        } else {
            err = UC_ERR_ARG;
        }
        break;
    }

    case UC_CTL_TCG_BUFFER_SIZE: {
        if (rw == UC_CTL_IO_WRITE) {
            uint32_t size = va_arg(args, uint32_t);
            uc->tcg_buffer_size = size;
        } else {

            UC_INIT(uc);

            uint32_t *size = va_arg(args, uint32_t *);
            *size = uc->tcg_buffer_size;
        }
        break;
    }

    case UC_CTL_CONTEXT_MODE:

        UC_INIT(uc);

        if (rw == UC_CTL_IO_WRITE) {
            int mode = va_arg(args, int);
            uc->context_content = mode;
            err = UC_ERR_OK;
        } else {
            err = UC_ERR_ARG;
        }
        break;

    default:
        err = UC_ERR_ARG;
        break;
    }

    va_end(args);

    return err;
}